

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

uint64_t Catch::ulpDistance<double>(double lhs,double rhs)

{
  bool bVar1;
  bool bVar2;
  uint64_t uVar3;
  int in_EDI;
  double in_XMM0_Qa;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  uint64_t rc;
  uint64_t lc;
  uint64_t local_28;
  double in_stack_ffffffffffffffe0;
  double __x;
  double local_10;
  uint64_t local_8;
  
  __x = (double)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  if ((in_XMM0_Qa != __x) || (NAN(in_XMM0_Qa) || NAN(__x))) {
    local_10 = in_XMM0_Qa;
    if ((in_XMM0_Qa == 0.0) && (!NAN(in_XMM0_Qa))) {
      local_10 = 0.0;
    }
    if ((__x == 0.0) && (!NAN(__x))) {
      __x = 0.0;
    }
    bVar1 = std::signbit(local_10);
    bVar2 = std::signbit(__x);
    if (bVar1 == bVar2) {
      local_8 = Detail::convertToBits(local_10);
      local_28 = Detail::convertToBits(__x);
      if (local_8 < local_28) {
        std::swap<unsigned_long>((unsigned_long *)&stack0xffffffffffffffe0,&local_28);
      }
      local_8 = local_8 - local_28;
    }
    else {
      std::abs(in_EDI);
      local_8 = ulpDistance<double>(__x,in_stack_ffffffffffffffe0);
      std::abs(in_EDI);
      uVar3 = ulpDistance<double>(__x,in_stack_ffffffffffffffe0);
      local_8 = local_8 + uVar3;
    }
  }
  else {
    local_8 = 0;
  }
  return local_8;
}

Assistant:

uint64_t ulpDistance( FP lhs, FP rhs ) {
        assert( std::numeric_limits<FP>::is_iec559 &&
            "ulpDistance assumes IEEE-754 format for floating point types" );
        assert( !Catch::isnan( lhs ) &&
                "Distance between NaN and number is not meaningful" );
        assert( !Catch::isnan( rhs ) &&
                "Distance between NaN and number is not meaningful" );

        // We want X == Y to imply 0 ULP distance even if X and Y aren't
        // bit-equal (-0 and 0), or X - Y != 0 (same sign infinities).
        if ( lhs == rhs ) { return 0; }

        // We need a properly typed positive zero for type inference.
        static constexpr FP positive_zero{};

        // We want to ensure that +/- 0 is always represented as positive zero
        if ( lhs == positive_zero ) { lhs = positive_zero; }
        if ( rhs == positive_zero ) { rhs = positive_zero; }

        // If arguments have different signs, we can handle them by summing
        // how far are they from 0 each.
        if ( std::signbit( lhs ) != std::signbit( rhs ) ) {
            return ulpDistance( std::abs( lhs ), positive_zero ) +
                   ulpDistance( std::abs( rhs ), positive_zero );
        }

        // When both lhs and rhs are of the same sign, we can just
        // read the numbers bitwise as integers, and then subtract them
        // (assuming IEEE).
        uint64_t lc = Detail::convertToBits( lhs );
        uint64_t rc = Detail::convertToBits( rhs );

        // The ulp distance between two numbers is symmetric, so to avoid
        // dealing with overflows we want the bigger converted number on the lhs
        if ( lc < rc ) {
            std::swap( lc, rc );
        }

        return lc - rc;
    }